

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress4X2_DCtx_wksp_bmi2
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  uint uVar1;
  void *in_RCX;
  HUF_DTable *in_R8;
  void *in_R9;
  size_t hSize;
  BYTE *ip;
  void *dst_00;
  undefined8 local_8;
  
  dst_00 = in_RCX;
  local_8 = (HUF_DTable *)HUF_readDTableX2_wksp(dctx,dst,dstSize,cSrc,cSrcSize);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    if (local_8 < in_R8) {
      local_8 = (HUF_DTable *)
                HUF_decompress4X2_usingDTable_internal
                          (dst_00,(long)in_R8 - (long)local_8,in_R9,(long)local_8 + (long)in_RCX,
                           local_8,0);
    }
    else {
      local_8 = (HUF_DTable *)0xffffffffffffffb8;
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t HUF_decompress4X2_DCtx_wksp_bmi2(HUF_DTable* dctx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int bmi2)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp (dctx, cSrc, cSrcSize,
                                                workSpace, wkspSize);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress4X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, dctx, bmi2);
}